

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  u8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  KeyInfo *pKVar8;
  MemPage *pMVar9;
  u8 *puVar10;
  u8 *puVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  uchar *pBuf;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  u32 amt;
  uint uVar19;
  u8 *p;
  uint uVar20;
  bool bVar21;
  i64 nCellKey;
  code *local_80;
  u64 local_38;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
      lVar12 = (pCur->info).nKey;
      if (lVar12 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar12 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_0014a6db;
        if (lVar12 + 1 == intKey) {
          *pRes = 0;
          iVar13 = sqlite3BtreeNext(pCur,0);
          if (iVar13 != 0x65) {
            if (iVar13 != 0) {
              return iVar13;
            }
            getCellInfo(pCur);
            local_80 = (code *)0x0;
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
            goto LAB_0014a2af;
          }
        }
      }
    }
    local_80 = (code *)0x0;
  }
  else {
    pKVar8 = pIdxKey->pKeyInfo;
    local_80 = sqlite3VdbeRecordCompare;
    if (pKVar8->nAllField < 0xe) {
      uVar6 = pIdxKey->aMem->flags;
      bVar21 = *pKVar8->aSortOrder == '\0';
      pIdxKey->r1 = -bVar21 | 1;
      pIdxKey->r2 = -!bVar21 | 1;
      if ((uVar6 & 4) == 0) {
        if (((uVar6 & 0x19) == 0) &&
           (local_80 = sqlite3VdbeRecordCompare, pKVar8->aColl[0] == (CollSeq *)0x0)) {
          local_80 = vdbeRecordCompareString;
        }
      }
      else {
        local_80 = vdbeRecordCompareInt;
      }
    }
    pIdxKey->errCode = '\0';
  }
LAB_0014a2af:
  iVar13 = moveToRoot(pCur);
  if (iVar13 != 0x10) {
    if (iVar13 != 0) {
      return iVar13;
    }
LAB_0014a2f6:
    pMVar9 = pCur->pPage;
    uVar6 = pMVar9->nCell;
    iVar13 = uVar6 - 1;
    uVar18 = iVar13 >> (1U - (char)biasRight & 0x1f);
    pCur->ix = (u16)uVar18;
    if (local_80 == (code *)0x0) {
      puVar10 = pMVar9->aDataOfst;
      uVar7 = pMVar9->maskPage;
      puVar11 = pMVar9->aCellIdx;
      uVar2 = pMVar9->intKeyLeaf;
      uVar20 = 0;
      do {
        p = puVar10 + (CONCAT11(puVar11[(long)(int)uVar18 * 2],puVar11[(long)(int)uVar18 * 2 + 1]) &
                      uVar7);
        if (uVar2 != '\0') {
          while ((char)*p < '\0') {
            p = p + 1;
            if (pMVar9->aDataEnd <= p) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c20,
                          "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
              return 0xb;
            }
          }
          p = p + 1;
        }
        sqlite3GetVarint(p,&local_38);
        uVar19 = uVar18;
        if ((long)local_38 < intKey) {
          uVar20 = uVar18 + 1;
          if (iVar13 <= (int)uVar18) goto LAB_0014a4fa;
        }
        else {
          if ((long)local_38 <= intKey) {
            pCur->ix = (u16)uVar18;
            if (pMVar9->leaf != '\0') {
              pCur->curFlags = pCur->curFlags | 2;
              (pCur->info).nKey = local_38;
              (pCur->info).nSize = 0;
              *pRes = 0;
              return 0;
            }
            goto LAB_0014a543;
          }
          if ((int)uVar18 <= (int)uVar20) {
            iVar14 = 1;
            uVar18 = uVar20;
            goto LAB_0014a530;
          }
          iVar13 = uVar18 - 1;
        }
        uVar18 = (int)(iVar13 + uVar20) >> 1;
      } while( true );
    }
    uVar20 = 0;
    do {
      puVar10 = pMVar9->aDataOfst;
      uVar16 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)(int)uVar18 * 2],
                                pMVar9->aCellIdx[(long)(int)uVar18 * 2 + 1]) & pMVar9->maskPage);
      pbVar15 = puVar10 + uVar16 + 1;
      bVar1 = puVar10[uVar16];
      uVar19 = (uint)bVar1;
      if (pMVar9->max1bytePayload < bVar1) {
        if ((-1 < (char)*pbVar15) &&
           (uVar19 = (bVar1 & 0x7f) << 7 | (int)(char)*pbVar15, uVar19 <= pMVar9->maxLocal)) {
          pbVar15 = puVar10 + uVar16 + 2;
          goto LAB_0014a41e;
        }
        (*pMVar9->xParseCell)(pMVar9,puVar10 + (uVar16 - pMVar9->childPtrSize),&pCur->info);
        uVar16 = (pCur->info).nKey;
        amt = (u32)uVar16;
        if (((int)amt < 2) ||
           (pCur->pBt->nPage < (uint)((uVar16 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
          uVar17 = 0x10c6a;
LAB_0014a679:
          iVar14 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar17,
                      "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
        }
        else {
          pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
          if (pBuf == (uchar *)0x0) {
            iVar14 = 7;
          }
          else {
            pCur->ix = (u16)uVar18;
            iVar14 = accessPayload(pCur,0,amt,pBuf,0);
            pCur->curFlags = pCur->curFlags & 0xfb;
            if (iVar14 == 0) {
              iVar14 = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
              sqlite3_free(pBuf);
              goto LAB_0014a428;
            }
            sqlite3_free(pBuf);
          }
        }
        goto LAB_0014a711;
      }
LAB_0014a41e:
      iVar14 = (*local_80)(uVar19,pbVar15,pIdxKey);
LAB_0014a428:
      if (iVar14 < 0) {
        uVar20 = uVar18 + 1;
      }
      else {
        if (iVar14 == 0) {
          *pRes = 0;
          pCur->ix = (u16)uVar18;
          if (pIdxKey->errCode != '\0') {
            uVar17 = 0x10c89;
            goto LAB_0014a679;
          }
          goto LAB_0014a70f;
        }
        iVar13 = uVar18 - 1;
      }
      uVar19 = uVar18;
      uVar18 = uVar20;
      if (iVar13 < (int)uVar20) goto LAB_0014a530;
      uVar18 = iVar13 + uVar20 >> 1;
    } while( true );
  }
LAB_0014a6db:
  *pRes = -1;
  return 0;
LAB_0014a4fa:
  iVar14 = -1;
  uVar18 = uVar20;
LAB_0014a530:
  if (pMVar9->leaf != '\0') {
    pCur->ix = (u16)uVar19;
    *pRes = iVar14;
LAB_0014a70f:
    iVar14 = 0;
    goto LAB_0014a711;
  }
  uVar6 = pMVar9->nCell;
LAB_0014a543:
  if ((int)uVar18 < (int)(uint)uVar6) {
    lVar12 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)(int)uVar18 * 2],
                              pMVar9->aCellIdx[(long)(int)uVar18 * 2 + 1]) & pMVar9->maskPage) + 3;
  }
  else {
    lVar12 = (ulong)pMVar9->hdrOffset + 0xb;
  }
  pbVar15 = pMVar9->aData + lVar12;
  bVar1 = pbVar15[-3];
  bVar3 = pbVar15[-2];
  bVar4 = pbVar15[-1];
  bVar5 = *pbVar15;
  pCur->ix = (u16)uVar18;
  iVar14 = moveToChild(pCur,(uint)bVar5 |
                            (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar1 << 0x18);
  if (iVar14 != 0) {
LAB_0014a711:
    (pCur->info).nSize = 0;
    return iVar14;
  }
  goto LAB_0014a2f6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PAGE(pPage);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
            rc = SQLITE_CORRUPT_PAGE(pPage);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}